

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxfastrt.h
# Opt level: O1

void __thiscall
soplex::
SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::SPxFastRT(SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            *this,SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  *old)

{
  char *pcVar1;
  int32_t iVar2;
  long lVar3;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar4;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar5;
  
  (this->
  super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  )._vptr_SPxRatioTester = (_func_int **)&PTR_getName_006b59a0;
  pcVar1 = (old->
           super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           ).m_name;
  (this->
  super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ).thesolver = (old->
                super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ).thesolver;
  (this->
  super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ).m_name = pcVar1;
  (this->
  super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ).m_type = (old->
             super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ).m_type;
  pnVar4 = &(old->
            super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            ).delta;
  pnVar5 = &(this->
            super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            ).delta;
  for (lVar3 = 0x1c; lVar3 != 0; lVar3 = lVar3 + -1) {
    (pnVar5->m_backend).data._M_elems[0] = (pnVar4->m_backend).data._M_elems[0];
    pnVar4 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
              *)((pnVar4->m_backend).data._M_elems + 1);
    pnVar5 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
              *)((pnVar5->m_backend).data._M_elems + 1);
  }
  (this->
  super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ).delta.m_backend.exp =
       (old->
       super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
       ).delta.m_backend.exp;
  (this->
  super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ).delta.m_backend.neg =
       (old->
       super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
       ).delta.m_backend.neg;
  iVar2 = (old->
          super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ).delta.m_backend.prec_elem;
  (this->
  super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ).delta.m_backend.fpclass =
       (old->
       super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
       ).delta.m_backend.fpclass;
  (this->
  super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ).delta.m_backend.prec_elem = iVar2;
  (this->
  super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  )._tolerances.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->
  super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  )._tolerances.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->
  super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  )._vptr_SPxRatioTester = (_func_int **)&PTR_getName_006b5aa8;
  pnVar4 = &old->minStab;
  pnVar5 = &this->minStab;
  for (lVar3 = 0xe; lVar3 != 0; lVar3 = lVar3 + -1) {
    *(undefined8 *)(pnVar5->m_backend).data._M_elems =
         *(undefined8 *)(pnVar4->m_backend).data._M_elems;
    pnVar4 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
              *)((pnVar4->m_backend).data._M_elems + 2);
    pnVar5 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
              *)((pnVar5->m_backend).data._M_elems + 2);
  }
  (this->minStab).m_backend.exp = (old->minStab).m_backend.exp;
  (this->minStab).m_backend.neg = (old->minStab).m_backend.neg;
  iVar2 = (old->minStab).m_backend.prec_elem;
  (this->minStab).m_backend.fpclass = (old->minStab).m_backend.fpclass;
  (this->minStab).m_backend.prec_elem = iVar2;
  pnVar4 = &old->epsilon;
  pnVar5 = &this->epsilon;
  for (lVar3 = 0xe; lVar3 != 0; lVar3 = lVar3 + -1) {
    *(undefined8 *)(pnVar5->m_backend).data._M_elems =
         *(undefined8 *)(pnVar4->m_backend).data._M_elems;
    pnVar4 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
              *)((pnVar4->m_backend).data._M_elems + 2);
    pnVar5 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
              *)((pnVar5->m_backend).data._M_elems + 2);
  }
  (this->epsilon).m_backend.exp = (old->epsilon).m_backend.exp;
  (this->epsilon).m_backend.neg = (old->epsilon).m_backend.neg;
  iVar2 = (old->epsilon).m_backend.prec_elem;
  (this->epsilon).m_backend.fpclass = (old->epsilon).m_backend.fpclass;
  (this->epsilon).m_backend.prec_elem = iVar2;
  pnVar4 = &old->fastDelta;
  pnVar5 = &this->fastDelta;
  for (lVar3 = 0xe; lVar3 != 0; lVar3 = lVar3 + -1) {
    *(undefined8 *)(pnVar5->m_backend).data._M_elems =
         *(undefined8 *)(pnVar4->m_backend).data._M_elems;
    pnVar4 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
              *)((pnVar4->m_backend).data._M_elems + 2);
    pnVar5 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
              *)((pnVar5->m_backend).data._M_elems + 2);
  }
  (this->fastDelta).m_backend.exp = (old->fastDelta).m_backend.exp;
  (this->fastDelta).m_backend.neg = (old->fastDelta).m_backend.neg;
  iVar2 = (old->fastDelta).m_backend.prec_elem;
  (this->fastDelta).m_backend.fpclass = (old->fastDelta).m_backend.fpclass;
  (this->fastDelta).m_backend.prec_elem = iVar2;
  this->iscoid = false;
  return;
}

Assistant:

SPxFastRT(const SPxFastRT& old)
      : SPxRatioTester<R>(old)
      , minStab(old.minStab)
      , epsilon(old.epsilon)
      , fastDelta(old.fastDelta)
      , iscoid(false)
   {}